

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_dce.c
# Opt level: O2

void lj_opt_dce(jit_State *J)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  SnapShot *pSVar6;
  SnapEntry *pSVar7;
  IRIns *pIVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  IRRef ref;
  long alStack_328 [101];
  
  if ((J->flags & 0x40000) != 0) {
    uVar3 = (J->cur).nsnap;
    for (uVar9 = 0; uVar9 != uVar3; uVar9 = uVar9 + 1) {
      pSVar6 = (J->cur).snap;
      uVar5 = pSVar6[uVar9].mapofs;
      pSVar7 = (J->cur).snapmap;
      bVar2 = pSVar6[uVar9].nent;
      for (uVar11 = 0; bVar2 != uVar11; uVar11 = uVar11 + 1) {
        uVar4 = (ushort)pSVar7[uVar5 + uVar11];
        if (0x8000 < uVar4) {
          pbVar1 = (byte *)((long)(J->cur).ir + (ulong)uVar4 * 8 + 4);
          *pbVar1 = *pbVar1 | 0x20;
        }
      }
    }
    for (lVar10 = 0; lVar10 != 0xca; lVar10 = lVar10 + 2) {
      *(long *)((long)alStack_328 + lVar10 * 4) = (long)J->chain + lVar10;
    }
    uVar9 = (ulong)((J->cur).nins - 1);
    lVar10 = uVar9 * 8 + 6;
    for (; 0x8000 < (uint)uVar9; uVar9 = (ulong)((uint)uVar9 - 1)) {
      pIVar8 = (J->cur).ir;
      bVar2 = *(byte *)((long)pIVar8 + lVar10 + -2);
      if ((bVar2 & 0x20) == 0) {
        uVar11 = (ulong)*(byte *)((long)pIVar8 + lVar10 + -1);
        if (0x5f < ((bVar2 | 0x60) & lj_ir_mode[uVar11])) goto LAB_00146e5c;
        *(undefined2 *)alStack_328[uVar11] = *(undefined2 *)((long)pIVar8 + lVar10);
        *(undefined8 *)((long)pIVar8 + lVar10 + -6) = 0xc0000000000;
      }
      else {
        *(byte *)((long)pIVar8 + lVar10 + -2) = bVar2 & 0xdf;
        uVar11 = (ulong)*(byte *)((long)pIVar8 + lVar10 + -1);
LAB_00146e5c:
        alStack_328[uVar11] = (long)pIVar8 + lVar10;
        uVar11 = (ulong)*(ushort *)((long)pIVar8 + lVar10 + -6);
        if (0x8000 < uVar11) {
          pbVar1 = (byte *)((long)(J->cur).ir + uVar11 * 8 + 4);
          *pbVar1 = *pbVar1 | 0x20;
        }
        uVar11 = (ulong)*(ushort *)((long)pIVar8 + lVar10 + -4);
        if (0x8000 < uVar11) {
          pbVar1 = (byte *)((long)(J->cur).ir + uVar11 * 8 + 4);
          *pbVar1 = *pbVar1 | 0x20;
        }
      }
      lVar10 = lVar10 + -8;
    }
    J->bpropcache[0xe].key = 0;
    J->bpropcache[0xe].val = 0;
    J->bpropcache[0xe].mode = 0;
    J->bpropcache[0xf].key = 0;
    J->bpropcache[0xf].val = 0;
    J->bpropcache[0xf].mode = 0;
    J->bpropcache[0xc].key = 0;
    J->bpropcache[0xc].val = 0;
    J->bpropcache[0xc].mode = 0;
    J->bpropcache[0xd].key = 0;
    J->bpropcache[0xd].val = 0;
    J->bpropcache[0xd].mode = 0;
    J->bpropcache[10].key = 0;
    J->bpropcache[10].val = 0;
    J->bpropcache[10].mode = 0;
    J->bpropcache[0xb].key = 0;
    J->bpropcache[0xb].val = 0;
    J->bpropcache[0xb].mode = 0;
    J->bpropcache[8].key = 0;
    J->bpropcache[8].val = 0;
    J->bpropcache[8].mode = 0;
    J->bpropcache[9].key = 0;
    J->bpropcache[9].val = 0;
    J->bpropcache[9].mode = 0;
    J->bpropcache[6].key = 0;
    J->bpropcache[6].val = 0;
    J->bpropcache[6].mode = 0;
    J->bpropcache[7].key = 0;
    J->bpropcache[7].val = 0;
    J->bpropcache[7].mode = 0;
    J->bpropcache[4].key = 0;
    J->bpropcache[4].val = 0;
    J->bpropcache[4].mode = 0;
    J->bpropcache[5].key = 0;
    J->bpropcache[5].val = 0;
    J->bpropcache[5].mode = 0;
    J->bpropcache[2].key = 0;
    J->bpropcache[2].val = 0;
    J->bpropcache[2].mode = 0;
    J->bpropcache[3].key = 0;
    J->bpropcache[3].val = 0;
    J->bpropcache[3].mode = 0;
    J->bpropcache[0].key = 0;
    J->bpropcache[0].val = 0;
    J->bpropcache[0].mode = 0;
    J->bpropcache[1].key = 0;
    J->bpropcache[1].val = 0;
    J->bpropcache[1].mode = 0;
  }
  return;
}

Assistant:

void lj_opt_dce(jit_State *J)
{
  if ((J->flags & JIT_F_OPT_DCE)) {
    dce_marksnap(J);
    dce_propagate(J);
    memset(J->bpropcache, 0, sizeof(J->bpropcache));  /* Invalidate cache. */
  }
}